

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_UInt FT_Get_Name_Index(FT_Face face,FT_String *glyph_name)

{
  FT_Module_Requester p_Var1;
  FT_UInt FVar2;
  FT_Module_Interface pvVar3;
  FT_Face_Internal pFVar4;
  FT_Module_Interface pvVar5;
  
  if (((face != (FT_Face)0x0) && (glyph_name != (FT_String *)0x0)) &&
     ((face->face_flags & 0x200U) != 0)) {
    pFVar4 = face->internal;
    pvVar3 = (pFVar4->services).service_GLYPH_DICT;
    if (pvVar3 != (FT_Module_Interface)0xfffffffffffffffe) {
      if (pvVar3 == (FT_Module_Interface)0x0) {
        p_Var1 = ((face->driver->root).clazz)->get_interface;
        if (p_Var1 == (FT_Module_Requester)0x0) {
          pvVar3 = (FT_Module_Interface)0x0;
        }
        else {
          pvVar3 = (*p_Var1)(&face->driver->root,"glyph-dict");
          pFVar4 = face->internal;
        }
        pvVar5 = (FT_Module_Interface)0xfffffffffffffffe;
        if (pvVar3 != (FT_Module_Interface)0x0) {
          pvVar5 = pvVar3;
        }
        (pFVar4->services).service_GLYPH_DICT = pvVar5;
      }
      if ((pvVar3 != (FT_Module_Interface)0x0) && (*(code **)((long)pvVar3 + 8) != (code *)0x0)) {
        FVar2 = (**(code **)((long)pvVar3 + 8))(face,glyph_name);
        return FVar2;
      }
    }
  }
  return 0;
}

Assistant:

FT_EXPORT_DEF( FT_UInt )
  FT_Get_Name_Index( FT_Face           face,
                     const FT_String*  glyph_name )
  {
    FT_UInt  result = 0;


    if ( face                       &&
         FT_HAS_GLYPH_NAMES( face ) &&
         glyph_name                 )
    {
      FT_Service_GlyphDict  service;


      FT_FACE_LOOKUP_SERVICE( face,
                              service,
                              GLYPH_DICT );

      if ( service && service->name_index )
        result = service->name_index( face, glyph_name );
    }

    return result;
  }